

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

vector<duckdb::Value,_true> * duckdb::StructValue::GetChildren(Value *value)

{
  ExtraValueInfo *this;
  NestedValueInfo *pNVar1;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (value->is_null != true) {
    this = shared_ptr<duckdb::ExtraValueInfo,_true>::operator->(&value->value_info_);
    pNVar1 = ExtraValueInfo::Get<duckdb::NestedValueInfo>(this);
    return &pNVar1->values;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Calling StructValue::GetChildren on a NULL value",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const vector<Value> &StructValue::GetChildren(const Value &value) {
	if (value.is_null) {
		throw InternalException("Calling StructValue::GetChildren on a NULL value");
	}
	D_ASSERT(value.type().InternalType() == PhysicalType::STRUCT);
	D_ASSERT(value.value_info_);
	return value.value_info_->Get<NestedValueInfo>().GetValues();
}